

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O3

void upb::generator::AddExtensionsFromMessage
               (MessageDefPtr message,
               vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *exts)

{
  int iVar1;
  int iVar2;
  upb_FieldDef *in_RAX;
  MessageDefPtr message_00;
  FieldDefPtr local_28;
  
  local_28.ptr_ = in_RAX;
  iVar1 = upb_MessageDef_NestedExtensionCount(message.ptr_);
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      local_28.ptr_ = upb_MessageDef_NestedExtension(message.ptr_,iVar1);
      std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::
      emplace_back<upb::FieldDefPtr>(exts,&local_28);
      iVar1 = iVar1 + 1;
      iVar2 = upb_MessageDef_NestedExtensionCount(message.ptr_);
    } while (iVar1 < iVar2);
  }
  iVar1 = upb_MessageDef_NestedMessageCount(message.ptr_);
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      message_00.ptr_ = upb_MessageDef_NestedMessage(message.ptr_,iVar1);
      AddExtensionsFromMessage(message_00,exts);
      iVar1 = iVar1 + 1;
      iVar2 = upb_MessageDef_NestedMessageCount(message.ptr_);
    } while (iVar1 < iVar2);
  }
  return;
}

Assistant:

void AddExtensionsFromMessage(upb::MessageDefPtr message,
                              std::vector<upb::FieldDefPtr>* exts) {
  for (int i = 0; i < message.nested_extension_count(); i++) {
    exts->push_back(message.nested_extension(i));
  }
  for (int i = 0; i < message.nested_message_count(); i++) {
    AddExtensionsFromMessage(message.nested_message(i), exts);
  }
}